

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

void __thiscall
amrex::DistributionMapping::RoundRobinDoIt
          (DistributionMapping *this,int nboxes,int param_2,
          vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *LIpairV,bool sort)

{
  uint nprocs;
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  Print *pPVar4;
  pointer piVar5;
  long lVar6;
  ostringstream *poVar7;
  int iVar8;
  int i;
  size_type __new_size;
  ulong uVar9;
  allocator_type local_219;
  Vector<int,_std::allocator<int>_> ord;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  wrkerord;
  Vector<int,_std::allocator<int>_> w;
  Print local_1b8;
  
  pPVar4 = (Print *)this;
  if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
    poVar2 = OutStream();
    Print::Print(&local_1b8,poVar2);
    std::operator<<((ostream *)&local_1b8.ss,"DM: RoundRobinDoIt called...");
    std::endl<char,std::char_traits<char>>((ostream *)&local_1b8.ss);
    pPVar4 = &local_1b8;
    Print::~Print(pPVar4);
  }
  nprocs = *(uint *)(DAT_006e0650 + -0x38);
  __new_size = (size_type)(int)nprocs;
  ord.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ord.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ord.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wrkerord.
  super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  .
  super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  wrkerord.
  super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  .
  super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  wrkerord.
  super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  .
  super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (sort) {
    LeastUsedCPUs((DistributionMapping *)pPVar4,nprocs,&ord);
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize
              (&ord.super_vector<int,_std::allocator<int>_>,__new_size);
    iVar8 = 0;
    for (piVar5 = ord.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        piVar5 != ord.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish; piVar5 = piVar5 + 1) {
      *piVar5 = iVar8;
      iVar8 = iVar8 + 1;
    }
  }
  std::
  vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::resize(&wrkerord.
            super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
           ,__new_size);
  lVar6 = 0;
  uVar3 = 0;
  if (0 < (int)nprocs) {
    uVar3 = (ulong)nprocs;
  }
  for (; uVar3 * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               ((long)&((wrkerord.
                         super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start + lVar6),1);
    **(undefined4 **)
      ((long)&((wrkerord.
                super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                .
                super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->super_vector<int,_std::allocator<int>_>)
              .super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start + lVar6) = 0;
  }
  local_1b8.rank = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&w.super_vector<int,_std::allocator<int>_>,__new_size,&local_1b8.rank,&local_219);
  uVar3 = 0;
  if (0 < nboxes) {
    uVar3 = (ulong)(uint)nboxes;
  }
  if (LIpairV == (vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)0x0) {
    poVar7 = &local_1b8.ss;
    for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
      iVar8 = ord.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [(long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) %
               (long)(int)nprocs & 0xffffffff];
      w.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar8] =
           w.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar8] + 1;
      iVar8 = *wrkerord.
               super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
               .
               super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar8].
               super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar8;
      iVar1 = ParallelContext::local_to_global_rank(iVar8);
      *(int *)(*(long *)&(((this->m_ref).
                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar9 * 4) = iVar1;
      if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
        poVar2 = OutStream();
        Print::Print(&local_1b8,poVar2);
        std::operator<<((ostream *)poVar7,"  Mapping box ");
        std::ostream::operator<<(poVar7,(int)uVar9);
        std::operator<<((ostream *)poVar7," to rank ");
        std::ostream::operator<<(poVar7,iVar8);
        std::endl<char,std::char_traits<char>>((ostream *)poVar7);
        Print::~Print(&local_1b8);
      }
    }
  }
  else {
    lVar6 = 8;
    for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
      iVar8 = ord.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [(long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) %
               (long)(int)nprocs & 0xffffffff];
      w.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar8] =
           w.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar8] + 1;
      iVar8 = *wrkerord.
               super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
               .
               super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar8].
               super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar8;
      iVar1 = ParallelContext::local_to_global_rank(iVar8);
      *(int *)(*(long *)&(((this->m_ref).
                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl +
              (long)*(int *)((long)&((LIpairV->
                                     super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->first + lVar6) * 4
              ) = iVar1;
      if (::(anonymous_namespace)::flag_verbose_mapper != 0) {
        poVar2 = OutStream();
        Print::Print(&local_1b8,poVar2);
        std::operator<<((ostream *)&local_1b8.ss,"  Mapping box ");
        pPVar4 = Print::operator<<(&local_1b8,
                                   (int *)((long)&((LIpairV->
                                                                                                      
                                                  super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                          + lVar6));
        std::operator<<((ostream *)&pPVar4->ss," of size ");
        pPVar4 = Print::operator<<(pPVar4,(long *)((long)(LIpairV->
                                                                                                                  
                                                  super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  lVar6 + -8));
        poVar7 = &pPVar4->ss;
        std::operator<<((ostream *)poVar7," to rank ");
        std::ostream::operator<<(poVar7,iVar8);
        std::endl<char,std::char_traits<char>>((ostream *)poVar7);
        Print::~Print(&local_1b8);
      }
      lVar6 = lVar6 + 0x10;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&w);
  std::
  vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::~vector(&wrkerord.
             super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
           );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ord);
  return;
}

Assistant:

void
DistributionMapping::RoundRobinDoIt (int                  nboxes,
                                     int                 /* nprocs */,
                                     std::vector<LIpair>* LIpairV,
                                     bool                 sort)
{
    if (flag_verbose_mapper) {
        Print() << "DM: RoundRobinDoIt called..." << std::endl;
    }

    int nprocs = ParallelContext::NProcsSub();

    // If team is not use, we are going to treat it as a special case in which
    // the number of teams is nprocs and the number of workers is 1.

    int nteams = nprocs;
    int nworkers = 1;
#if defined(BL_USE_TEAM)
    nteams = ParallelDescriptor::NTeams();
    nworkers = ParallelDescriptor::TeamSize();
#endif

    Vector<int> ord;
    Vector<Vector<int> > wrkerord;

    if (nteams == nprocs)  {
        if (sort) {
            LeastUsedCPUs(nprocs,ord);
        } else {
            ord.resize(nprocs);
            std::iota(ord.begin(), ord.end(), 0);
        }
        wrkerord.resize(nprocs);
        for (int i = 0; i < nprocs; ++i) {
            wrkerord[i].resize(1);
            wrkerord[i][0] = 0;
        }
    } else {
        if (sort) {
            LeastUsedTeams(ord,wrkerord,nteams,nworkers);
        } else {
            ord.resize(nteams);
            std::iota(ord.begin(), ord.end(), 0);
            wrkerord.resize(nteams);
            for (auto& v : wrkerord) {
                v.resize(nworkers);
                std::iota(v.begin(), v.end(), 0);
            }
        }
    }

    Vector<int> w(nteams,0);

    if (LIpairV)
    {
        BL_ASSERT(static_cast<int>(LIpairV->size()) == nboxes);

        for (int i = 0; i < nboxes; ++i)
        {
            int tid = ord[i%nteams];
            int wid = (w[tid]++) % nworkers;
            int rank = tid*nworkers + wrkerord[tid][wid];
            m_ref->m_pmap[(*LIpairV)[i].second] = ParallelContext::local_to_global_rank(rank);
            if (flag_verbose_mapper) {
                Print() << "  Mapping box " << (*LIpairV)[i].second << " of size "
                        << (*LIpairV)[i].first << " to rank " << rank << std::endl;
            }
        }
    }
    else
    {
        for (int i = 0; i < nboxes; ++i)
        {
            int tid = ord[i%nteams];
            int wid = (w[tid]++) % nworkers;
            int rank = tid*nworkers + wrkerord[tid][wid];
            m_ref->m_pmap[i] = ParallelContext::local_to_global_rank(rank);
            if (flag_verbose_mapper) {
                Print() << "  Mapping box " << i << " to rank " << rank << std::endl;
            }
        }
    }
}